

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Request * __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,PromiseNetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  undefined8 uVar2;
  undefined8 uVar3;
  PromiseBase node;
  PromiseArenaMember *node_00;
  OwnPromiseNode OVar4;
  void *pvVar5;
  int __flags;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  Event *pEVar7;
  void *__arg;
  TransformPromiseNodeBase *this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6219:11),_void>
  combined;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  undefined1 local_188 [40];
  Event *pEStack_160;
  ForkBranchBase *pFStack_158;
  PromiseBase local_150;
  PromiseArenaMember *local_148;
  char local_140;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_138;
  OwnPromiseNode local_130;
  Event *pEStack_128;
  ForkBranchBase *pFStack_120;
  undefined1 local_118 [96];
  char *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  Maybe<unsigned_long> local_a0;
  HttpHeaders local_90;
  char *pcVar6;
  
  pvVar5 = (void *)url.content.size_;
  local_188._24_8_ = __return_storage_ptr__;
  if ((this->client).ptr.ptr == (NetworkAddressHttpClient *)0x0) {
    pcVar6 = url.content.ptr;
    __arg = pvVar5;
    heapString((String *)(local_188 + 0x20),(long)pvVar5 - 1);
    __flags = (int)pcVar6;
    __child_stack = extraout_RDX;
    if ((long)pvVar5 - 1U != 0) {
      pEVar7 = pEStack_160;
      if (pEStack_160 != (Event *)0x0) {
        pEVar7 = (Event *)local_188._32_8_;
      }
      memcpy(pEVar7,url.content.ptr,(long)pvVar5 - 1U);
      __child_stack = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_90,(__fn *)headers,__child_stack,__flags,__arg);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_188);
    uVar2 = local_188._0_8_;
    local_148 = (PromiseArenaMember *)CONCAT44(local_148._4_4_,method);
    local_140 = (expectedBodySize->ptr).isSet;
    if ((bool)local_140 == true) {
      local_138 = (expectedBodySize->ptr).field_1;
    }
    local_130.ptr = (PromiseNode *)local_188._32_8_;
    pEStack_128 = pEStack_160;
    pFStack_120 = pFStack_158;
    local_188._32_8_ = (Event *)0x0;
    pEStack_160 = (Event *)0x0;
    local_118._0_8_ = local_90.table;
    local_118._8_8_ = local_90.indexedHeaders.ptr;
    local_118._16_8_ = local_90.indexedHeaders.size_;
    local_118._24_8_ = local_90.indexedHeaders.disposer;
    local_118._32_8_ = local_90.unindexedHeaders.builder.ptr;
    local_90.indexedHeaders.ptr = (StringPtr *)0x0;
    local_90.indexedHeaders.size_ = 0;
    local_118._40_8_ = local_90.unindexedHeaders.builder.pos;
    local_118._48_8_ = local_90.unindexedHeaders.builder.endPtr;
    local_118._56_8_ = local_90.unindexedHeaders.builder.disposer;
    local_90.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_90.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_90.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_118._64_8_ = local_90.ownedStrings.builder.ptr;
    local_118._72_8_ = local_90.ownedStrings.builder.pos;
    local_118._80_8_ = local_90.ownedStrings.builder.endPtr;
    local_118._88_8_ = local_90.ownedStrings.builder.disposer;
    local_90.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_90.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_90.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    pPVar1 = ((PromiseArenaMember *)local_188._0_8_)->arena;
    local_150.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_188._0_8_ - (long)pPVar1) < 0xb8) {
      pvVar5 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x348);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_188,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6219:11)>
                 ::anon_class_152_5_b9fef01d_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x348) = &PTR_destroy_006406a8;
      ((OwnPromiseNode *)((long)pvVar5 + 0x368))->ptr = (PromiseNode *)local_150.node.ptr;
      *(undefined4 *)((long)pvVar5 + 0x370) = local_148._0_4_;
      *(char *)((long)pvVar5 + 0x378) = local_140;
      if (local_140 == '\x01') {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)((long)pvVar5 + 0x380) =
             local_138;
        local_140 = '\0';
      }
      *(PromiseNode **)((long)pvVar5 + 0x388) = local_130.ptr;
      *(Event **)((long)pvVar5 + 0x390) = pEStack_128;
      *(ForkBranchBase **)((long)pvVar5 + 0x398) = pFStack_120;
      *(undefined8 *)((long)pvVar5 + 0x3a0) = local_118._0_8_;
      *(undefined8 *)((long)pvVar5 + 0x3a8) = local_118._8_8_;
      *(undefined8 *)((long)pvVar5 + 0x3b0) = local_118._16_8_;
      *(undefined8 *)((long)pvVar5 + 0x3b8) = local_118._24_8_;
      *(undefined8 *)((long)pvVar5 + 0x3c0) = local_118._32_8_;
      *(undefined8 *)((long)pvVar5 + 0x3c8) = local_118._40_8_;
      *(undefined8 *)((long)pvVar5 + 0x3d0) = local_118._48_8_;
      *(undefined8 *)((long)pvVar5 + 0x3d8) = local_118._56_8_;
      *(undefined8 *)((long)pvVar5 + 0x3e0) = local_118._64_8_;
      *(undefined8 *)((long)pvVar5 + 1000) = local_118._72_8_;
      *(undefined8 *)((long)pvVar5 + 0x3f0) = local_118._80_8_;
      *(undefined8 *)((long)pvVar5 + 0x3f8) = local_118._88_8_;
      *(void **)((long)pvVar5 + 0x350) = pvVar5;
    }
    else {
      ((PromiseArenaMember *)local_188._0_8_)->arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)(local_188._0_8_ + -0xc0))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_188,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6219:11)>
                 ::anon_class_152_5_b9fef01d_for_func::operator());
      ((PromiseArenaMember *)(uVar2 + -0xc0))->arena = (PromiseArena *)&PTR_destroy_006406a8;
      ((PromiseArenaMember *)(uVar2 + -0xa0))->arena = (PromiseArena *)local_150.node.ptr;
      *(undefined4 *)&((PromiseArenaMember *)(uVar2 + -0x90))->_vptr_PromiseArenaMember =
           local_148._0_4_;
      *(char *)&((PromiseArenaMember *)(uVar2 + -0x90))->arena = local_140;
      if (local_140 == '\x01') {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(uVar2 + -0x80) = local_138;
        local_140 = '\0';
      }
      ((PromiseArenaMember *)(uVar2 + -0x80))->arena = (PromiseArena *)local_130.ptr;
      ((PromiseArenaMember *)(uVar2 + -0x70))->_vptr_PromiseArenaMember = (_func_int **)pEStack_128;
      ((PromiseArenaMember *)(uVar2 + -0x70))->arena = (PromiseArena *)pFStack_120;
      ((PromiseArenaMember *)(uVar2 + -0x60))->_vptr_PromiseArenaMember =
           (_func_int **)local_118._0_8_;
      ((PromiseArenaMember *)(uVar2 + -0x60))->arena = (PromiseArena *)local_118._8_8_;
      ((PromiseArenaMember *)(uVar2 + -0x50))->_vptr_PromiseArenaMember =
           (_func_int **)local_118._16_8_;
      ((PromiseArenaMember *)(uVar2 + -0x50))->arena = (PromiseArena *)local_118._24_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember =
           (_func_int **)local_118._32_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->arena = (PromiseArena *)local_118._40_8_;
      ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)local_118._48_8_;
      ((PromiseArenaMember *)(uVar2 + -0x30))->arena = (PromiseArena *)local_118._56_8_;
      ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)local_118._64_8_;
      ((PromiseArenaMember *)(uVar2 + -0x20))->arena = (PromiseArena *)local_118._72_8_;
      ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember =
           (_func_int **)local_118._80_8_;
      ((PromiseArenaMember *)(uVar2 + -0x10))->arena = (PromiseArena *)local_118._88_8_;
      ((PromiseArenaMember *)(uVar2 + -0xb0))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_118._80_8_ = (Disposer *)0x0;
    local_118._72_8_ = (ArrayDisposer *)0x0;
    local_118._64_8_ = 0;
    local_118._48_8_ = 0;
    local_118._40_8_ = (char *)0x0;
    local_118._32_8_ = (ArrayDisposer *)0x0;
    local_118._16_8_ = (char *)0x0;
    local_118._8_8_ = (StringPtr *)0x0;
    pEStack_128 = (Event *)0x0;
    local_130.ptr = (PromiseNode *)0x0;
    local_188._8_8_ = this_00;
    HttpHeaders::~HttpHeaders((HttpHeaders *)local_118);
    pEVar7 = pEStack_128;
    OVar4.ptr = local_130.ptr;
    if (local_130.ptr != (PromiseNode *)0x0) {
      local_130.ptr = (PromiseNode *)0x0;
      pEStack_128 = (Event *)0x0;
      (**(pFStack_120->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember)
                (pFStack_120,OVar4.ptr,1,pEVar7,pEVar7,0);
    }
    uVar2 = local_188._0_8_;
    if ((PromiseArenaMember *)local_188._0_8_ != (PromiseArenaMember *)0x0) {
      local_188._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    uStack_b0 = (long)"URL for HTTP request" + 0xd;
    local_a8 = (ArrayDisposer *)0x1400001851;
    location.function = "request";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location.lineNumber = 0x1851;
    location.columnNumber = 0x14;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)&local_150,location);
    uVar3 = local_188._24_8_;
    local_188._16_8_ = local_150.node.ptr;
    local_150.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    newPromisedStream((kj *)local_188._24_8_,
                      (Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)(local_188 + 0x10)
                     );
    uVar2 = local_188._16_8_;
    (((Promise<kj::HttpClient::Response> *)(uVar3 + 0x10))->super_PromiseBase).node.ptr =
         (PromiseNode *)local_148;
    local_148 = (PromiseArenaMember *)0x0;
    if ((PromiseNetworkAddressHttpClient *)local_188._16_8_ !=
        (PromiseNetworkAddressHttpClient *)0x0) {
      local_188._16_8_ = (PromiseNetworkAddressHttpClient *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    node_00 = local_148;
    if (local_148 != (PromiseArenaMember *)0x0) {
      local_148 = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose(node_00);
    }
    node.node.ptr = local_150.node.ptr;
    if (local_150.node.ptr != (PromiseNode *)0x0) {
      local_150.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    uVar2 = local_188._8_8_;
    if ((TransformPromiseNodeBase *)local_188._8_8_ != (TransformPromiseNodeBase *)0x0) {
      local_188._8_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    HttpHeaders::~HttpHeaders(&local_90);
    pEVar7 = pEStack_160;
    uVar2 = local_188._32_8_;
    __return_storage_ptr__ = (Request *)local_188._24_8_;
    if ((Event *)local_188._32_8_ != (Event *)0x0) {
      local_188._32_8_ = (Event *)0x0;
      pEStack_160 = (Event *)0x0;
      (**(pFStack_158->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember)
                (pFStack_158,uVar2,1,pEVar7,pEVar7,0);
    }
  }
  else {
    local_a0.ptr.isSet = (expectedBodySize->ptr).isSet;
    if (local_a0.ptr.isSet == true) {
      local_a0.ptr.field_1 = (expectedBodySize->ptr).field_1;
    }
    NetworkAddressHttpClient::request
              (__return_storage_ptr__,(this->client).ptr.ptr,method,url,headers,&local_a0);
  }
  return (Request *)(EventLoop *)__return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(c, client) {
      return c->request(method, url, headers, expectedBodySize);
    }